

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_NumExtensionsWithRepeatedFields_Test::
TestBody(ExtensionSetTest_NumExtensionsWithRepeatedFields_Test *this)

{
  bool bVar1;
  int number;
  Descriptor *this_00;
  FileDescriptor *this_01;
  char *pcVar2;
  AssertHelper local_d8;
  Message local_d0;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a8;
  Message local_a0;
  void *local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  FieldDescriptor *local_70;
  FieldDescriptor *desc;
  undefined1 local_58 [8];
  ExtensionSet set;
  TestAllExtensions msg;
  ExtensionSetTest_NumExtensionsWithRepeatedFields_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)&set.map_);
  ExtensionSet::ExtensionSet((ExtensionSet *)local_58);
  this_00 = proto2_unittest::TestAllExtensions::descriptor();
  this_01 = Descriptor::file(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "repeated_int32_extension");
  local_70 = FileDescriptor::FindExtensionByName(this_01,stack0xffffffffffffff80);
  local_98 = (void *)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
            ((internal *)local_90,"desc","nullptr",&local_70,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x598,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    number = FieldDescriptor::number(local_70);
    ExtensionSet::MutableRawRepeatedField((ExtensionSet *)local_58,number,'\x05',false,local_70);
    local_c4 = ExtensionSet::NumExtensions((ExtensionSet *)local_58);
    local_c8 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_c0,"set.NumExtensions()","1",&local_c4,&local_c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x59b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ExtensionSet::~ExtensionSet((ExtensionSet *)local_58);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)&set.map_);
  return;
}

Assistant:

TEST(ExtensionSetTest, NumExtensionsWithRepeatedFields) {
  unittest::TestAllExtensions msg;
  ExtensionSet set;
  const auto* desc =
      unittest::TestAllExtensions::descriptor()->file()->FindExtensionByName(
          "repeated_int32_extension");
  ASSERT_NE(desc, nullptr);
  set.MutableRawRepeatedField(desc->number(), WireFormatLite::TYPE_INT32, false,
                              desc);
  EXPECT_EQ(set.NumExtensions(), 1);
}